

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O1

void rw::hanimInterpCB(void *vout,void *vin1,void *vin2,float32 t,void *param_5)

{
  float fVar1;
  float fVar2;
  float a;
  Quat QVar3;
  
  a = ((float)t - *(float *)((long)vin1 + 8)) /
      (*(float *)((long)vin2 + 8) - *(float *)((long)vin1 + 8));
  fVar1 = *(float *)((long)vin1 + 0x24);
  fVar2 = *(float *)((long)vin2 + 0x24);
  *(ulong *)((long)vout + 0x20) =
       CONCAT44((*(float *)((long)vin2 + 0x20) - *(float *)((long)vin1 + 0x20)) * a +
                *(float *)((long)vin1 + 0x20),
                (*(float *)((long)vin2 + 0x1c) - *(float *)((long)vin1 + 0x1c)) * a +
                *(float *)((long)vin1 + 0x1c));
  *(float *)((long)vout + 0x28) = (fVar2 - fVar1) * a + fVar1;
  QVar3 = slerp((Quat *)((long)vin1 + 0xc),(Quat *)((long)vin2 + 0xc),(float32)a);
  *(Quat *)((long)vout + 0x10) = QVar3;
  return;
}

Assistant:

static void
hanimInterpCB(void *vout, void *vin1, void *vin2, float32 t, void*)
{
	HAnimInterpFrame *out = (HAnimInterpFrame*)vout;
	HAnimKeyFrame *in1 = (HAnimKeyFrame*)vin1;
	HAnimKeyFrame *in2 = (HAnimKeyFrame*)vin2;
assert(t >= in1->time && t <= in2->time);
	float32 a = (t - in1->time)/(in2->time - in1->time);
	out->t =  lerp(in1->t, in2->t, a);
	out->q = slerp(in1->q, in2->q, a);
}